

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O0

void __thiscall ftxui::TerminalInputParser::Timeout(TerminalInputParser *this,int time)

{
  Output output;
  long lVar1;
  Output local_30;
  int local_14;
  TerminalInputParser *pTStack_10;
  int time_local;
  TerminalInputParser *this_local;
  
  this->timeout_ = time + this->timeout_;
  if (0x31 < this->timeout_) {
    this->timeout_ = 0;
    local_14 = time;
    pTStack_10 = this;
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      Output::Output(&local_30,SPECIAL);
      output.field_1._4_8_ = local_30.field_1._4_8_;
      output._0_8_ = local_30._0_8_;
      output.field_1._12_8_ = local_30.field_1._12_8_;
      Send(this,output);
    }
  }
  return;
}

Assistant:

void TerminalInputParser::Timeout(int time) {
  timeout_ += time;
  if (timeout_ < 50)
    return;
  timeout_ = 0;
  if (pending_.size())
    Send(SPECIAL);
}